

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# code.cxx
# Opt level: O0

void write_cstring(char *s,int length)

{
  char cVar1;
  uint uVar2;
  char *pcVar3;
  int local_30;
  int local_2c;
  int c;
  int linelength;
  char *e;
  char *p;
  int length_local;
  char *s_local;
  
  if (varused_test == 0) {
    local_2c = 1;
    putc(0x22,(FILE *)code_file);
    e = s;
LAB_001b31e6:
    while (e < s + length) {
      pcVar3 = e + 1;
      local_30 = (int)*e;
      switch(local_30) {
      case 8:
        local_30 = 0x62;
        break;
      case 9:
        local_30 = 0x74;
        break;
      case 10:
        local_30 = 0x6e;
        break;
      default:
        goto switchD_001b322f_caseD_b;
      case 0xc:
        local_30 = 0x66;
        break;
      case 0xd:
        local_30 = 0x72;
        break;
      case 0x22:
      case 0x27:
      case 0x5c:
        break;
      case 0x3f:
        if ((e + -1 < s) || (e[-1] != '?')) goto switchD_001b322f_caseD_b;
      }
      if (0x4c < local_2c) {
        fputs("\\\n",(FILE *)code_file);
        local_2c = 0;
      }
      putc(0x5c,(FILE *)code_file);
      putc(local_30,(FILE *)code_file);
      local_2c = local_2c + 2;
      e = pcVar3;
    }
    putc(0x22,(FILE *)code_file);
  }
  else {
    varused = 1;
  }
  return;
switchD_001b322f_caseD_b:
  if ((local_30 < 0x20) || (0x7e < local_30)) {
    uVar2 = (uint)(byte)*e;
    if (uVar2 < 8) {
      if (0x4b < local_2c) {
        fputs("\\\n",(FILE *)code_file);
        local_2c = 0;
      }
      fprintf((FILE *)code_file,"\\%o",(ulong)uVar2);
      local_2c = local_2c + 2;
    }
    else if (uVar2 < 0x40) {
      if (0x4a < local_2c) {
        fputs("\\\n",(FILE *)code_file);
        local_2c = 0;
      }
      fprintf((FILE *)code_file,"\\%o",(ulong)uVar2);
      local_2c = local_2c + 3;
    }
    else {
      if (0x49 < local_2c) {
        fputs("\\\n",(FILE *)code_file);
        local_2c = 0;
      }
      fprintf((FILE *)code_file,"\\%o",(ulong)uVar2);
      local_2c = local_2c + 4;
    }
    cVar1 = *pcVar3;
    e = pcVar3;
    if ((pcVar3 < s + length) &&
       (((('/' < cVar1 && (cVar1 < ':')) || (('`' < cVar1 && (cVar1 < 'g')))) ||
        (('@' < cVar1 && (cVar1 < 'G')))))) {
      putc(0x22,(FILE *)code_file);
      local_2c = local_2c + 1;
      if (0x4e < local_2c) {
        fputs("\n",(FILE *)code_file);
        local_2c = 0;
      }
      putc(0x22,(FILE *)code_file);
      local_2c = local_2c + 1;
    }
  }
  else {
    if (0x4d < local_2c) {
      fputs("\\\n",(FILE *)code_file);
      local_2c = 0;
    }
    putc(local_30,(FILE *)code_file);
    local_2c = local_2c + 1;
    e = pcVar3;
  }
  goto LAB_001b31e6;
}

Assistant:

void write_cstring(const char *s, int length) {
  if (varused_test) {
    varused = 1;
    return;
  }
  const char *p = s;
  const char *e = s+length;
  int linelength = 1;
  putc('\"', code_file);
  for (; p < e;) {
    int c = *p++;
    switch (c) {
    case '\b': c = 'b'; goto QUOTED;
    case '\t': c = 't'; goto QUOTED;
    case '\n': c = 'n'; goto QUOTED;
    case '\f': c = 'f'; goto QUOTED;
    case '\r': c = 'r'; goto QUOTED;
    case '\"':
    case '\'':
    case '\\':
    QUOTED:
      if (linelength >= 77) {fputs("\\\n",code_file); linelength = 0;}
      putc('\\', code_file);
      putc(c, code_file);
      linelength += 2;
      break;
    case '?': // prevent trigraphs by writing ?? as ?\?
      if (p-2 >= s && *(p-2) == '?') goto QUOTED;
      // else fall through:
    default:
      if (c >= ' ' && c < 127) {
	// a legal ASCII character
	if (linelength >= 78) {fputs("\\\n",code_file); linelength = 0;}
	putc(c, code_file);
	linelength++;
	break;
      }
      // otherwise we must print it as an octal constant:
      c &= 255;
      if (c < 8) {
	if (linelength >= 76) {fputs("\\\n",code_file); linelength = 0;}
	fprintf(code_file, "\\%o",c);
	linelength += 2;
      } else if (c < 64) {
	if (linelength >= 75) {fputs("\\\n",code_file); linelength = 0;}
	fprintf(code_file, "\\%o",c);
	linelength += 3;
      } else {
	if (linelength >= 74) {fputs("\\\n",code_file); linelength = 0;}
	fprintf(code_file, "\\%o",c);
	linelength += 4;
      }
      // We must not put more numbers after it, because some C compilers
      // consume them as part of the quoted sequence.  Use string constant
      // pasting to avoid this:
      c = *p;
      if (p < e && ( (c>='0'&&c<='9') || (c>='a'&&c<='f') || (c>='A'&&c<='F') )) {
	putc('\"', code_file); linelength++;
	if (linelength >= 79) {fputs("\n",code_file); linelength = 0;}
	putc('\"', code_file); linelength++;
      }
      break;
    }
  }
  putc('\"', code_file);
}